

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O2

void replace_denormals_with_zero(float *data,size_t data_length)

{
  float fVar1;
  size_t i;
  
  for (i = 0; data_length != i; i = i + 1) {
    fVar1 = data[i];
    if ((ABS(fVar1) < 1e-30) && ((fVar1 != 0.0 || (NAN(fVar1))))) {
      data[i] = 0.0;
    }
  }
  return;
}

Assistant:

static void replace_denormals_with_zero(float* data, size_t data_length)
{
    const int total = static_cast<int>(data_length);
    for (size_t i = 0; i < data_length; ++i)
    {
        float value = data[i];

        if (fabsf(value) < 1e-30 && fabsf(value) != 0.f)
        {
            data[i] = 0.f;
        }
    }
}